

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

TimingControl * __thiscall slang::ast::ClockingBlockSymbol::getEvent(ClockingBlockSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  TimingControl *pTVar3;
  LookupLocation LVar4;
  ASTContext local_50;
  
  if (this->event != (TimingControl *)0x0) {
    return this->event;
  }
  pSVar1 = (this->super_Symbol).parentScope;
  pSVar2 = (this->super_Symbol).originatingSyntax;
  LVar4 = LookupLocation::before(&this->super_Symbol);
  local_50.lookupIndex = LVar4.index;
  local_50.flags.m_bits = 0;
  local_50.instanceOrProc = (Symbol *)0x0;
  local_50.firstTempVar = (TempVarSymbol *)0x0;
  local_50.randomizeDetails = (RandomizeDetails *)0x0;
  local_50.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_50.scope.ptr = pSVar1;
  pTVar3 = EventListControl::fromSyntax
                     ((this->super_Scope).compilation,*(SyntaxNode **)(pSVar2 + 6),&local_50);
  this->event = pTVar3;
  return pTVar3;
}

Assistant:

const TimingControl& ClockingBlockSymbol::getEvent() const {
    if (!event) {
        auto scope = getParentScope();
        auto syntax = getSyntax();
        SLANG_ASSERT(scope && syntax);

        ASTContext context(*scope, LookupLocation::before(*this));
        event = &EventListControl::fromSyntax(getCompilation(),
                                              *syntax->as<ClockingDeclarationSyntax>().event,
                                              context);
    }
    return *event;
}